

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

void __thiscall
nuraft::nuraft_global_mgr::close_raft_server(nuraft_global_mgr *this,raft_server *server)

{
  bool bVar1;
  int iVar2;
  __shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *in_RSI;
  ptr<logger> *l_;
  iterator entry_1;
  lock_guard<std::mutex> l_1;
  size_t num_aborted_commit;
  iterator entry;
  lock_guard<std::mutex> l;
  size_t num_aborted_append;
  mutex_type *in_stack_ffffffffffffff08;
  unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  *in_stack_ffffffffffffff10;
  const_iterator in_stack_ffffffffffffff18;
  string *format;
  string local_b8 [32];
  ptr<logger> *local_98;
  _List_node_base *local_90;
  _List_const_iterator<std::shared_ptr<nuraft::raft_server>_> local_88;
  _List_node_base *local_80;
  _Self local_78;
  _Self local_70 [2];
  long local_60;
  _List_node_base *local_58;
  _List_const_iterator<std::shared_ptr<nuraft::raft_server>_> local_50;
  _List_node_base *local_48;
  _Self local_30;
  _Self local_28 [2];
  long local_18;
  element_type *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_28[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
       ::begin((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                *)in_stack_ffffffffffffff08);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
         ::end((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                *)in_stack_ffffffffffffff08);
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) break;
    p_Var3 = &std::_List_iterator<std::shared_ptr<nuraft::raft_server>_>::operator->
                        ((_List_iterator<std::shared_ptr<nuraft::raft_server>_> *)0x2b9201)->
              super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::get(p_Var3);
    if (peVar4 == local_10) {
      std::_List_iterator<std::shared_ptr<nuraft::raft_server>_>::operator*
                ((_List_iterator<std::shared_ptr<nuraft::raft_server>_> *)0x2b9234);
      std::
      unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::erase(in_stack_ffffffffffffff10,(key_type *)in_stack_ffffffffffffff08);
      std::_List_const_iterator<std::shared_ptr<nuraft::raft_server>_>::_List_const_iterator
                (&local_50,local_28);
      local_48 = (_List_node_base *)
                 std::__cxx11::
                 list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                 ::erase((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                          *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
      local_18 = local_18 + 1;
      local_28[0]._M_node = local_48;
      break;
    }
    local_58 = (_List_node_base *)
               std::_List_iterator<std::shared_ptr<nuraft::raft_server>_>::operator++(local_28,0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2b92f7);
  local_60 = 0;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_70[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
       ::begin((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                *)in_stack_ffffffffffffff08);
  do {
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
         ::end((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                *)in_stack_ffffffffffffff08);
    bVar1 = std::operator!=(local_70,&local_78);
    if (!bVar1) {
LAB_002b9453:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2b9460);
      local_98 = &local_10->l_;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2b9490);
        iVar2 = (*peVar5->_vptr_logger[7])();
        if (3 < iVar2) {
          peVar5 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2b94ac);
          format = local_b8;
          msg_if_given_abi_cxx11_
                    ((char *)format,"global manager detected, %zu appends %zu commits are aborted",
                     local_18,local_60);
          (*peVar5->_vptr_logger[8])
                    (peVar5,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                     ,"close_raft_server",0xca,format);
          std::__cxx11::string::~string(local_b8);
        }
      }
      return;
    }
    p_Var3 = &std::_List_iterator<std::shared_ptr<nuraft::raft_server>_>::operator->
                        ((_List_iterator<std::shared_ptr<nuraft::raft_server>_> *)0x2b9379)->
              super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::get(p_Var3);
    if (peVar4 == local_10) {
      std::_List_iterator<std::shared_ptr<nuraft::raft_server>_>::operator*
                ((_List_iterator<std::shared_ptr<nuraft::raft_server>_> *)0x2b93ac);
      std::
      unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::erase(in_stack_ffffffffffffff10,(key_type *)in_stack_ffffffffffffff08);
      std::_List_const_iterator<std::shared_ptr<nuraft::raft_server>_>::_List_const_iterator
                (&local_88,local_70);
      local_80 = (_List_node_base *)
                 std::__cxx11::
                 list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                 ::erase((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                          *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
      local_60 = local_60 + 1;
      local_70[0]._M_node = local_80;
      goto LAB_002b9453;
    }
    local_90 = (_List_node_base *)
               std::_List_iterator<std::shared_ptr<nuraft::raft_server>_>::operator++(local_70,0);
  } while( true );
}

Assistant:

void nuraft_global_mgr::close_raft_server(raft_server* server) {
    // Cancel all requests for this raft server.
    size_t num_aborted_append = 0;
    {
        std::lock_guard<std::mutex> l(append_queue_lock_);
        auto entry = append_queue_.begin();
        while (entry != append_queue_.end()) {
            if (entry->get() == server) {
                append_server_set_.erase(*entry);
                entry = append_queue_.erase(entry);
                num_aborted_append++;
                break;
            } else {
                entry++;
            }
        }
    }

    size_t num_aborted_commit = 0;
    {
        std::lock_guard<std::mutex> l(commit_queue_lock_);
        auto entry = commit_queue_.begin();
        while (entry != commit_queue_.end()) {
            if (entry->get() == server) {
                commit_server_set_.erase(*entry);
                entry = commit_queue_.erase(entry);
                num_aborted_commit++;
                break;
            } else {
                entry++;
            }
        }
    }

    ptr<logger>& l_ = server->l_;
    p_in("global manager detected, %zu appends %zu commits are aborted",
         num_aborted_append,
         num_aborted_commit);
}